

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O2

void __thiscall QSplashScreen::drawContents(QSplashScreen *this,QPainter *painter)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  LayoutDirection direction;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QRect QVar9;
  QAnyStringView QVar10;
  int local_a8;
  QPoint local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QTextCursor cursor;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QPoint local_58;
  ulong local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  QPainter::setPen((QColor *)painter);
  QVar9 = QWidget::rect(&this->super_QWidget);
  uVar1 = QVar9._0_8_ + 5;
  uVar4 = QVar9._8_8_ + 0xfffffffb;
  uVar6 = (QVar9._0_8_ & 0xffffffff00000000) + 0x500000000;
  local_58 = (QPoint)(uVar1 & 0xffffffff | uVar6);
  uVar8 = (QVar9._8_8_ & 0xffffffff00000000) - 0x500000000;
  local_50 = uVar4 & 0xffffffff | uVar8;
  QVar10.m_size = *(ulong *)(lVar2 + 0x280) | 0x8000000000000000;
  QVar10.field_0.m_data = ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(lVar2 + 0x278))->m_data;
  cVar3 = Qt::mightBeRichText(QVar10);
  if (cVar3 == '\0') {
    QPainter::drawText((QRect *)painter,(int)&local_58,(QString *)(ulong)*(uint *)(lVar2 + 0x298),
                       (QRect *)(lVar2 + 0x270));
    goto LAB_0044622d;
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::QTextDocument((QTextDocument *)&local_68,(QObject *)0x0);
  QTextDocument::setHtml((QString *)&local_68);
  local_a8 = (int)uVar1;
  QTextDocument::setTextWidth((double)(((int)uVar4 - local_a8) + 1));
  _cursor = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor(&cursor,(QTextDocument *)&local_68);
  QTextCursor::select((SelectionType)&cursor);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_48);
  QTextBlockFormat::setAlignment
            ((QTextBlockFormat *)&local_48,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(lVar2 + 0x298))->
             super_QFlagsStorage<Qt::AlignmentFlag>);
  direction = QWidget::layoutDirection(&this->super_QWidget);
  QTextFormat::setLayoutDirection((QTextFormat *)&local_48,direction);
  QTextCursor::mergeBlockFormat((QTextBlockFormat *)&cursor);
  QTextDocument::size();
  iVar5 = (int)(uVar6 >> 0x20);
  iVar7 = (int)(uVar8 >> 0x20);
  if ((*(uint *)(lVar2 + 0x298) & 0x40) == 0) {
    if ((char)*(uint *)(lVar2 + 0x298) < '\0') {
      in_XMM1_Qa = in_XMM1_Qa * -0.5 + (double)(((iVar7 - iVar5) + 1) / 2);
      goto LAB_004461bd;
    }
  }
  else {
    in_XMM1_Qa = (double)((iVar7 - iVar5) + 1) - in_XMM1_Qa;
LAB_004461bd:
    local_58.yp.m_i = (int)in_XMM1_Qa;
  }
  QPainter::save();
  local_98 = local_58;
  QPainter::translate(painter,&local_98);
  local_88 = 0;
  uStack_80 = 0;
  local_98.xp.m_i = 0;
  local_98.yp.m_i = 0;
  uStack_90 = 0;
  QTextDocument::drawContents((QPainter *)&local_68,(QRectF *)painter);
  QPainter::restore();
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QTextCursor::~QTextCursor(&cursor);
  QTextDocument::~QTextDocument((QTextDocument *)&local_68);
LAB_0044622d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplashScreen::drawContents(QPainter *painter)
{
    Q_D(QSplashScreen);
    painter->setPen(d->currColor);
    QRect r = rect().adjusted(5, 5, -5, -5);
    if (Qt::mightBeRichText(d->currStatus)) {
        QTextDocument doc;
#ifdef QT_NO_TEXTHTMLPARSER
        doc.setPlainText(d->currStatus);
#else
        doc.setHtml(d->currStatus);
#endif
        doc.setTextWidth(r.width());
        QTextCursor cursor(&doc);
        cursor.select(QTextCursor::Document);
        QTextBlockFormat fmt;
        fmt.setAlignment(Qt::Alignment(d->currAlign));
        fmt.setLayoutDirection(layoutDirection());
        cursor.mergeBlockFormat(fmt);
        const QSizeF txtSize = doc.size();
        if (d->currAlign & Qt::AlignBottom)
            r.setTop(r.height() - txtSize.height());
        else if (d->currAlign & Qt::AlignVCenter)
            r.setTop(r.height() / 2 - txtSize.height() / 2);
        painter->save();
        painter->translate(r.topLeft());
        doc.drawContents(painter);
        painter->restore();
    } else {
        painter->drawText(r, d->currAlign, d->currStatus);
    }
}